

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
 __thiscall ArgumentParser::ActionMap::Emplace(ActionMap *this,string_view name,Action *action)

{
  pointer ppVar1;
  int iVar2;
  ulong uVar3;
  iterator __position;
  char *__s2;
  ulong __n;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  ulong __n_00;
  long lVar5;
  difference_type __d;
  ulong uVar6;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __s2 = name._M_str;
  __n_00 = name._M_len;
  __position._M_current =
       (this->
       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
       ).
       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)ppVar1 - (long)__position._M_current;
  local_40._M_len = __n_00;
  local_40._M_str = __s2;
  if (0 < (long)uVar3) {
    uVar3 = (uVar3 >> 4) * -0x5555555555555555;
    do {
      uVar6 = uVar3 >> 1;
      __n = __position._M_current[uVar6].first._M_len;
      lVar5 = __n - __n_00;
      if (__n_00 <= __n) {
        __n = __n_00;
      }
      if (__n == 0) {
LAB_00344657:
        if (lVar5 < -0x7fffffff) {
          lVar5 = -0x80000000;
        }
        if (0x7ffffffe < lVar5) {
          lVar5 = 0x7fffffff;
        }
        iVar2 = (int)lVar5;
      }
      else {
        iVar2 = memcmp(__position._M_current[uVar6].first._M_str,__s2,__n);
        if (iVar2 == 0) goto LAB_00344657;
      }
      if (iVar2 < 0) {
        __position._M_current = __position._M_current + uVar6 + 1;
        uVar6 = ~uVar6 + uVar3;
      }
      uVar3 = uVar6;
    } while (0 < (long)uVar6);
  }
  if ((__position._M_current == ppVar1) || (((__position._M_current)->first)._M_len != __n_00)) {
LAB_003446b9:
    __position = std::
                 vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&,void*)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&,void*)>>>>
                 ::
                 _M_emplace_aux<std::basic_string_view<char,std::char_traits<char>>&,std::function<void(ArgumentParser::Instance&,void*)>>
                           ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&,void*)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&,void*)>>>>
                             *)this,__position._M_current,&local_40,action);
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    if (__n_00 != 0) {
      iVar2 = bcmp(((__position._M_current)->first)._M_str,__s2,__n_00);
      if (iVar2 != 0) goto LAB_003446b9;
    }
    uVar4 = 0;
  }
  pVar7._8_8_ = uVar4;
  pVar7.first._M_current = __position._M_current;
  return pVar7;
}

Assistant:

auto ActionMap::Emplace(cm::string_view name, Action action)
  -> std::pair<iterator, bool>
{
  auto const it =
    std::lower_bound(this->begin(), this->end(), name,
                     [](value_type const& elem, cm::string_view const& k) {
                       return elem.first < k;
                     });
  return (it != this->end() && it->first == name)
    ? std::make_pair(it, false)
    : std::make_pair(this->emplace(it, name, std::move(action)), true);
}